

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O0

void __thiscall
cp::interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setInter5
          (interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          Matrix<double,_2,_1,_0,_2,_1> *xb,Matrix<double,_2,_1,_0,_2,_1> *dxb,
          Matrix<double,_2,_1,_0,_2,_1> *ddxb,Matrix<double,_2,_1,_0,_2,_1> *xe,
          Matrix<double,_2,_1,_0,_2,_1> *dxe,Matrix<double,_2,_1,_0,_2,_1> *ddxe,double t)

{
  double local_1458;
  double local_1450;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_1448;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1430;
  double local_13f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_13f0;
  double local_13c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_13c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1398;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1338;
  double local_12b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_12b0;
  double local_1288;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_1280;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1258;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_11f8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_1108;
  CwiseBinaryOp<_b4ee638e_> local_fd0;
  double local_e78;
  double local_e70;
  double local_e68;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_e60;
  double local_e38;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_e30;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_e08;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_da8;
  double local_d28;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_d20;
  double local_cf8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_cf0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_cc8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_c68;
  double local_be8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_be0;
  double local_bb8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_bb0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_b88;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_b28;
  CwiseBinaryOp<_ea030bd9_> local_a38;
  CwiseBinaryOp<_b981712e_> local_8b8;
  double local_718;
  double local_710;
  double local_708;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_700;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_6d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_698;
  double local_638;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_630;
  double local_608;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_600;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_5d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_578;
  double local_4f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_4f0;
  double local_4c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_4c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_498;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_438;
  CwiseBinaryOp<_b40fe90_> local_348;
  CwiseBinaryOp<_8ae60117_> local_1e8;
  double local_68;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_60;
  double local_40;
  double t_local;
  Matrix<double,_2,_1,_0,_2,_1> *dxe_local;
  Matrix<double,_2,_1,_0,_2,_1> *xe_local;
  Matrix<double,_2,_1,_0,_2,_1> *ddxb_local;
  Matrix<double,_2,_1,_0,_2,_1> *dxb_local;
  Matrix<double,_2,_1,_0,_2,_1> *xb_local;
  interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_local;
  
  local_40 = t;
  t_local = (double)dxe;
  dxe_local = xe;
  xe_local = ddxb;
  ddxb_local = dxb;
  dxb_local = xb;
  xb_local = this->a;
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(this->a,xb);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(this->a + 1,dxb);
  local_68 = 0.5;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            (&local_60,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)ddxb,&local_68);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)(this->a + 2),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&local_60);
  local_4c8 = 20.0;
  Eigen::operator*(&local_4c0,&local_4c8,(StorageBaseType *)xe);
  local_4f8 = 20.0;
  Eigen::operator*(&local_4f0,&local_4f8,(StorageBaseType *)xb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator-(&local_498,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_4c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_4f0);
  local_608 = 8.0;
  Eigen::operator*(&local_600,&local_608,(StorageBaseType *)dxe);
  local_638 = 12.0;
  Eigen::operator*(&local_630,&local_638,(StorageBaseType *)dxb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator+(&local_5d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_600,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_630);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator*(&local_578,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_5d8,&local_40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator-(&local_438,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_498,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_578);
  local_708 = 3.0;
  Eigen::operator*(&local_700,&local_708,(StorageBaseType *)ddxb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator-(&local_6d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_700,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)ddxe);
  local_710 = pow(local_40,2.0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator*(&local_698,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_6d8,&local_710);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator-(&local_348,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_438,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_698);
  local_718 = pow(local_40,3.0);
  local_718 = local_718 * 2.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator/(&local_1e8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_348,&local_718);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)(this->a + 3),(DenseBase<_44af09a0_> *)&local_1e8);
  local_bb8 = 30.0;
  Eigen::operator*(&local_bb0,&local_bb8,(StorageBaseType *)xb);
  local_be8 = 30.0;
  Eigen::operator*(&local_be0,&local_be8,(StorageBaseType *)xe);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator-(&local_b88,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_bb0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_be0);
  local_cf8 = 14.0;
  Eigen::operator*(&local_cf0,&local_cf8,(StorageBaseType *)dxe);
  local_d28 = 16.0;
  Eigen::operator*(&local_d20,&local_d28,(StorageBaseType *)dxb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator+(&local_cc8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_cf0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_d20);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator*(&local_c68,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_cc8,&local_40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator+(&local_b28,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_b88,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_c68);
  local_e38 = 3.0;
  Eigen::operator*(&local_e30,&local_e38,(StorageBaseType *)ddxb);
  local_e68 = 2.0;
  Eigen::operator*(&local_e60,&local_e68,(StorageBaseType *)ddxe);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator-(&local_e08,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_e30,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_e60);
  local_e70 = pow(local_40,2.0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator*(&local_da8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_e08,&local_e70);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator+(&local_a38,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_b28,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_da8);
  local_e78 = pow(local_40,4.0);
  local_e78 = local_e78 * 2.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matr...aryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator/(&local_8b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matr___aryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_a38,&local_e78);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)(this->a + 4),(DenseBase<_67897137_> *)&local_8b8);
  local_1288 = 12.0;
  Eigen::operator*(&local_1280,&local_1288,(StorageBaseType *)xe);
  local_12b8 = 12.0;
  Eigen::operator*(&local_12b0,&local_12b8,(StorageBaseType *)xb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator-(&local_1258,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_1280,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_12b0);
  local_13c8 = 6.0;
  Eigen::operator*(&local_13c0,&local_13c8,(StorageBaseType *)dxe);
  local_13f8 = 6.0;
  Eigen::operator*(&local_13f0,&local_13f8,(StorageBaseType *)dxb);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator+(&local_1398,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_13c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)&local_13f0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator*(&local_1338,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_1398,&local_40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator-(&local_11f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_1258,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_1338);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (&local_1448,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)ddxb,
             (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)ddxe);
  local_1450 = pow(local_40,2.0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
  ::operator*(&local_1430,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
               *)&local_1448,&local_1450);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator-(&local_1108,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_11f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
               *)&local_1430);
  local_1458 = pow(local_40,5.0);
  local_1458 = local_1458 * 2.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
  ::operator/(&local_fd0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
               *)&local_1108,&local_1458);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)(this->a + 5),(DenseBase<_e2f76957_> *)&local_fd0);
  return;
}

Assistant:

void interpolation<T>::setInter5(T xb, T dxb, T ddxb, T xe, T dxe, T ddxe, double t) {
    a[0] = xb;
    a[1] = dxb;
    a[2] = ddxb * 0.5;
    a[3] = (20.0*xe - 20.0*xb - ( 8.0*dxe + 12.0*dxb)*t - (3.0*ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 3));
    a[4] = (30.0*xb - 30.0*xe + (14.0*dxe + 16.0*dxb)*t + (3.0*ddxb - 2.0*ddxe)*pow(t, 2)) / (2.0*pow(t, 4));
    a[5] = (12.0*xe - 12.0*xb - ( 6.0*dxe +  6.0*dxb)*t - (    ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 5));
}